

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jansson_helper.c
# Opt level: O2

char * get_mem_options_inner(json_t *root,char *option_name,int *result,int should_free)

{
  json_t *json;
  size_t __size;
  char *__dest;
  char *__src;
  
  json = json_object_get(root,option_name);
  if (json == (json_t *)0x0) {
    if (should_free != 0) {
      json_decref(root);
    }
    *result = 0;
  }
  else {
    if (json->type == JSON_MEM) {
      __size = json_mem_length(json);
      __dest = (char *)malloc(__size);
      __src = json_mem_value(json);
      memcpy(__dest,__src,__size);
      *result = 1;
      if (should_free == 0) {
        return __dest;
      }
      json_decref(root);
      return __dest;
    }
    *result = -1;
    fprintf(_stderr,"error: option item %s is expected to be a mem\n",option_name);
    if (should_free == 0) {
      return (char *)0x0;
    }
    json_decref(root);
  }
  return (char *)0x0;
}

Assistant:

static char * get_mem_options_inner(json_t * root, const char * option_name, int * result, int should_free)
{
	json_t *option_item;
	char * option_value;
	size_t length;

	option_item = json_object_get(root, option_name);
	if (!option_item)
	{
		if (should_free)
			json_decref(root);
		*result = 0;
		return NULL;
	}

	if (!json_is_mem(option_item))
	{
		*result = -1;
		fprintf(stderr, "error: option item %s is expected to be a mem\n", option_name);
		if (should_free)
			json_decref(root);
		return NULL;
	}

	length = json_mem_length(option_item);
	option_value = malloc(length);
	memcpy(option_value, json_mem_value(option_item), length);
	*result = 1;
	if (should_free)
		json_decref(root);
	return option_value;
}